

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_fwrite(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  undefined8 in_RAX;
  char *pcVar5;
  jx9_value *pjVar6;
  anon_union_8_3_18420de5_for_x aVar7;
  int nLen;
  undefined8 uStack_38;
  
  if ((((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (plVar2 = (long *)((*apArg)->x).pOther, plVar2 == (long *)0x0)) ||
     (*(int *)((long)plVar2 + 0x34) != 0xfeac14)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Expecting an IO handle");
LAB_0013f14b:
    pjVar6 = pCtx->pRet;
    jx9MemObjRelease(pjVar6);
  }
  else {
    puVar3 = (undefined8 *)*plVar2;
    if ((puVar3 == (undefined8 *)0x0) || (puVar3[8] == 0)) {
      if (puVar3 == (undefined8 *)0x0) {
        pcVar5 = "null_stream";
      }
      else {
        pcVar5 = (char *)*puVar3;
      }
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                 ,(pCtx->pFunc->sName).zString,pcVar5);
      goto LAB_0013f14b;
    }
    uStack_38 = in_RAX;
    pcVar5 = jx9_value_to_string(apArg[1],(int *)((long)&uStack_38 + 4));
    if (nArg != 2) {
      pjVar6 = apArg[2];
      jx9MemObjToInteger(pjVar6);
      iVar1 = *(int *)&pjVar6->x;
      if ((-1 < iVar1) && (iVar1 < uStack_38._4_4_)) {
        uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
      }
    }
    if (uStack_38._4_4_ < 1) {
      pjVar6 = pCtx->pRet;
      jx9MemObjRelease(pjVar6);
      (pjVar6->x).rVal = 0.0;
LAB_0013f1c5:
      uVar4 = 2;
      goto LAB_0013f163;
    }
    uVar4 = (*(code *)puVar3[8])(plVar2[1],pcVar5);
    pjVar6 = pCtx->pRet;
    jx9MemObjRelease(pjVar6);
    if (-1 < (int)uVar4) {
      aVar7._0_4_ = uVar4 & 0x7fffffff;
      aVar7.iVal._4_4_ = 0;
      pjVar6->x = aVar7;
      goto LAB_0013f1c5;
    }
  }
  (pjVar6->x).rVal = 0.0;
  uVar4 = 8;
LAB_0013f163:
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | uVar4;
  return 0;
}

Assistant:

static int jx9Builtin_fwrite(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zString;
	io_private *pDev;
	int nLen, n;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/* Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xWrite == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the data to write */
	zString = jx9_value_to_string(apArg[1], &nLen);
	if( nArg > 2 ){
		/* Maximum data length to write */
		n = jx9_value_to_int(apArg[2]);
		if( n >= 0 && n < nLen ){
			nLen = n;
		}
	}
	if( nLen < 1 ){
		/* Nothing to write */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	n = (int)pStream->xWrite(pDev->pHandle, (const void *)zString, nLen);
	if( n <  0 ){
		/* IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* #Bytes written */
		jx9_result_int(pCtx, n);
	}
	return JX9_OK;
}